

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSString * js_alloc_string(JSContext *ctx,int max_len,int is_wide_char)

{
  JSRuntime *pJVar1;
  JSString *pJVar2;
  
  pJVar2 = (JSString *)
           (*(ctx->rt->mf).js_malloc)
                     (&ctx->rt->malloc_state,
                      ((long)(max_len << ((byte)is_wide_char & 0x1f)) - (ulong)(uint)is_wide_char) +
                      0x11);
  if (pJVar2 == (JSString *)0x0) {
    pJVar2 = (JSString *)0x0;
  }
  else {
    (pJVar2->header).ref_count = 1;
    *(ulong *)&pJVar2->field_0x4 = (ulong)(max_len & 0x7fffffffU | is_wide_char << 0x1f);
    pJVar2->hash_next = 0;
  }
  if (pJVar2 == (JSString *)0x0) {
    pJVar1 = ctx->rt;
    if (pJVar1->field_0xf0 == '\0') {
      pJVar1->field_0xf0 = 1;
      pJVar2 = (JSString *)0x0;
      JS_ThrowInternalError(ctx,"out of memory");
      pJVar1->field_0xf0 = 0;
    }
    else {
      pJVar2 = (JSString *)0x0;
    }
  }
  return pJVar2;
}

Assistant:

static JSString *js_alloc_string(JSContext *ctx, int max_len, int is_wide_char)
{
    JSString *p;
    p = js_alloc_string_rt(ctx->rt, max_len, is_wide_char);
    if (unlikely(!p)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    return p;
}